

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O1

void __thiscall MutableS2ShapeIndex::Iterator::Copy(Iterator *this,IteratorBase *other)

{
  MutableS2ShapeIndex *pMVar1;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *pbVar2;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *pbVar3;
  
  if (other->_vptr_IteratorBase == (_func_int **)&PTR__IteratorBase_002c10d0) {
    (this->super_IteratorBase).id_.id_ = (other->id_).id_;
    (this->super_IteratorBase).cell_._M_b._M_p = (other->cell_)._M_b._M_p;
    (this->end_).position = (int)other[2].id_.id_;
    pMVar1 = (MutableS2ShapeIndex *)other[1]._vptr_IteratorBase;
    pbVar2 = (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
              *)other[1].id_.id_;
    pbVar3 = (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
              *)other[2]._vptr_IteratorBase;
    *(__pointer_type *)&(this->iter_).position = other[1].cell_._M_b._M_p;
    (this->end_).node = pbVar3;
    this->index_ = pMVar1;
    (this->iter_).node = pbVar2;
    return;
  }
  __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/base/casts.h"
                ,0x44,
                "To down_cast(From *) [To = const MutableS2ShapeIndex::Iterator *, From = const S2ShapeIndex::IteratorBase]"
               );
}

Assistant:

inline To down_cast(From* f) {           // so we only accept pointers
  static_assert(
      (std::is_base_of<From, typename std::remove_pointer<To>::type>::value),
      "target type not derived from source type");

  // We skip the assert and hence the dynamic_cast if RTTI is disabled.
#if !defined(__GNUC__) || defined(__GXX_RTTI)
  // Uses RTTI in dbg and fastbuild. asserts are disabled in opt builds.
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);
#endif  // !defined(__GNUC__) || defined(__GXX_RTTI)

  return static_cast<To>(f);
}